

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall EventLoop::loop(EventLoop *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar1;
  int iVar2;
  pointer in_RCX;
  nfds_t in_RDX;
  nfds_t extraout_RDX;
  nfds_t extraout_RDX_00;
  nfds_t extraout_RDX_01;
  shared_ptr<Channel> *it;
  undefined1 auVar3 [8];
  undefined1 auVar4 [8];
  int *in_FS_OFFSET;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  pointer peStack_78;
  pointer local_70;
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> local_68;
  undefined1 auStack_48 [8];
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> ret;
  
  if (this->looping_ == true) {
    __assert_fail("!looping_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoop.cpp"
                  ,0x5c,"void EventLoop::loop()");
  }
  iVar2 = this->threadId_;
  if (*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
    in_RDX = extraout_RDX_01;
  }
  if (iVar2 != *in_FS_OFFSET) {
    __assert_fail("isInLoopThread()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoop.cpp"
                  ,0x5d,"void EventLoop::loop()");
  }
  this->looping_ = true;
  this->quit_ = false;
  auStack_48 = (undefined1  [8])0x0;
  ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (psVar1 = ret.
                  super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, auVar4 = auStack_48,
        iVar2 = (int)in_RCX, this->quit_ == false) {
    auVar3 = auStack_48;
    if ((undefined1  [8])
        ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_48) {
      do {
        this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar3)->_M_use_count)->_M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          in_RDX = extraout_RDX;
        }
        iVar2 = (int)in_RCX;
        auVar3 = (undefined1  [8])((long)auVar3 + 0x10);
      } while (auVar3 != (undefined1  [8])psVar1);
      ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)auVar4;
    }
    Epoll::poll((Epoll *)&local_80,
                (pollfd *)
                (this->poller_).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in_RDX,
                iVar2);
    local_68.
    super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         ret.
         super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>._M_impl
    .super__Vector_impl_data._M_finish =
         ret.
         super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_68.
    super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)auStack_48;
    in_RCX = local_70;
    auStack_48 = (undefined1  [8])local_80;
    ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)peStack_78;
    ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_70;
    local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_78 = (pointer)0x0;
    local_70 = (pointer)0x0;
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
              (&local_68);
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
              ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
               &local_80);
    psVar1 = ret.
             super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this->eventHandling_ = true;
    for (auVar4 = auStack_48; auVar4 != (undefined1  [8])psVar1;
        auVar4 = (undefined1  [8])((long)auVar4 + 0x10)) {
      Channel::handleEvents
                (((__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar4)->_vptr__Sp_counted_base)
                 ->_M_ptr);
    }
    this->eventHandling_ = false;
    doPendingFunctors(this);
    Epoll::handleExpired
              ((this->poller_).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    in_RDX = extraout_RDX_00;
  }
  this->looping_ = false;
  std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
            ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
             auStack_48);
  return;
}

Assistant:

void EventLoop::loop() { //在哪个线程建立的对象，就在哪个线程执行loop
  assert(!looping_);
  assert(isInLoopThread());
  looping_ = true;
  quit_ = false;
  // LOG_TRACE << "EventLoop " << this << " start looping";
  std::vector<SP_Channel> ret;
  while (!quit_) {
    // cout << "doing" << endl;
    ret.clear();
    ret = poller_->poll();
    eventHandling_ = true;
    for (auto& it : ret) it->handleEvents();
    eventHandling_ = false;
    doPendingFunctors();
    poller_->handleExpired();
  }
  looping_ = false;
}